

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O3

void test_write<io::posix::file&>(file *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *__stream;
  ResultBuilder *this;
  string read_buf;
  ResultBuilder __catchResult;
  SourceLineInfo local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  ResultBuilder local_2c0;
  
  Catch::SourceLineInfo::SourceLineInfo
            (&local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/file_test.cpp"
             ,0x22);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c0,"REQUIRE_NOTHROW",&local_308,
             "io::write(file, io::buffer(test_file_contents))",Normal,"");
  paVar1 = &local_308.file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_308.file._M_dataplus._M_p,local_308.file.field_2._M_allocated_capacity + 1
                   );
  }
  local_308.file._M_dataplus._M_p = "The quick brown fox jumps over the lazy dog";
  local_308.file._M_string_length = 0x2b;
  io::net::write<io::posix::file,io::net::const_buffer,io::net::transfer_all,void>(file);
  Catch::ResultBuilder::captureResult(&local_2c0,Ok);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c0);
  Catch::ResultBuilder::react(&local_2c0);
  Catch::ResultBuilder::~ResultBuilder(&local_2c0);
  __stream = fopen("io_test_file.txt","rb");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2e0,'+');
  fread(local_2e0._M_dataplus._M_p,1,0x2b,__stream);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/file_test.cpp"
             ,0x28);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c0,"REQUIRE",&local_308,"test_file_contents == read_buf",Normal,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_308.file._M_dataplus._M_p,local_308.file.field_2._M_allocated_capacity + 1
                   );
  }
  local_308.file._M_string_length = (size_type)&test_file_contents;
  local_308.file._M_dataplus._M_p = (pointer)&local_2c0;
  this = Catch::ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&>::
         captureExpression<(Catch::Internal::Operator)0,std::__cxx11::string>
                   ((ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&> *)
                    &local_308,&local_2e0);
  Catch::ResultBuilder::endExpression(this);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c0);
  Catch::ResultBuilder::react(&local_2c0);
  Catch::ResultBuilder::~ResultBuilder(&local_2c0);
  fclose(__stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_write(File&& file)
{
    REQUIRE_NOTHROW(io::write(file, io::buffer(test_file_contents)));

    FILE* in_file = std::fopen(test_file_name, "rb");
    std::string read_buf(test_file_contents.size(), '\0');
    std::fread(&*read_buf.begin(), 1, test_file_contents.size(), in_file);

    REQUIRE(test_file_contents == read_buf);

    std::fclose(in_file);
}